

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.cpp
# Opt level: O3

void __thiscall nonstd::thread_pool::thread_pool(thread_pool *this,int n)

{
  int iVar1;
  
  *(undefined8 *)((long)&(this->m).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->m).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m).super___mutex_base._M_mutex + 8) = 0;
  (this->m).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->cond);
  (this->jobs).c.
  super__Deque_base<nonstd::thread_pool::job_info_*,_std::allocator<nonstd::thread_pool::job_info_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->jobs).c.
  super__Deque_base<nonstd::thread_pool::job_info_*,_std::allocator<nonstd::thread_pool::job_info_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->jobs).c.
  super__Deque_base<nonstd::thread_pool::job_info_*,_std::allocator<nonstd::thread_pool::job_info_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->jobs).c.
  super__Deque_base<nonstd::thread_pool::job_info_*,_std::allocator<nonstd::thread_pool::job_info_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->jobs).c.
  super__Deque_base<nonstd::thread_pool::job_info_*,_std::allocator<nonstd::thread_pool::job_info_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->jobs).c.
  super__Deque_base<nonstd::thread_pool::job_info_*,_std::allocator<nonstd::thread_pool::job_info_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->jobs).c.
  super__Deque_base<nonstd::thread_pool::job_info_*,_std::allocator<nonstd::thread_pool::job_info_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->jobs).c.
  super__Deque_base<nonstd::thread_pool::job_info_*,_std::allocator<nonstd::thread_pool::job_info_*>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->jobs).c.
  super__Deque_base<nonstd::thread_pool::job_info_*,_std::allocator<nonstd::thread_pool::job_info_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->thread_list).super__Vector_base<std::thread_*,_std::allocator<std::thread_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->jobs).c.
  super__Deque_base<nonstd::thread_pool::job_info_*,_std::allocator<nonstd::thread_pool::job_info_*>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->thread_list).super__Vector_base<std::thread_*,_std::allocator<std::thread_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->thread_list).super__Vector_base<std::thread_*,_std::allocator<std::thread_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  _Deque_base<nonstd::thread_pool::job_info_*,_std::allocator<nonstd::thread_pool::job_info_*>_>::
  _M_initialize_map((_Deque_base<nonstd::thread_pool::job_info_*,_std::allocator<nonstd::thread_pool::job_info_*>_>
                     *)&this->jobs,0);
  this->terminate = false;
  iVar1 = 1;
  if (1 < n) {
    iVar1 = n;
  }
  this->MAX_THREADS = iVar1;
  return;
}

Assistant:

thread_pool::thread_pool(int n):MAX_THREADS(n)
    {
        if (MAX_THREADS <= 0) MAX_THREADS = 1;
    }